

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O2

void __thiscall
Assimp::glTFExporter::GetTexSampler(glTFExporter *this,aiMaterial *mat,TexProperty *prop)

{
  Asset *this_00;
  Texture *pTVar1;
  undefined4 uVar2;
  Ref<glTF::Sampler> RVar3;
  aiTextureMapMode mapV;
  aiTextureMapMode mapU;
  string samplerId;
  
  this_00 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&mapU,"",(allocator<char> *)&mapV);
  glTF::Asset::FindUniqueID(&samplerId,this_00,(string *)&mapU,"sampler");
  std::__cxx11::string::~string((string *)&mapU);
  RVar3 = glTF::LazyDict<glTF::Sampler>::Create
                    (&((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->samplers,samplerId._M_dataplus._M_p);
  pTVar1 = (((prop->texture).vector)->
           super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>)._M_impl.
           super__Vector_impl_data._M_start[(prop->texture).index];
  (pTVar1->sampler).vector = RVar3.vector;
  *(uint *)((long)&pTVar1->sampler + 8) = RVar3.index;
  aiGetMaterialInteger(mat,"$tex.mapmodeu",1,0,(int *)&mapU);
  aiGetMaterialInteger(mat,"$tex.mapmodev",1,0,(int *)&mapV);
  pTVar1 = (((prop->texture).vector)->
           super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>)._M_impl.
           super__Vector_impl_data._M_start[(prop->texture).index];
  uVar2 = 0x2901;
  if (mapU == aiTextureMapMode_Clamp) {
    uVar2 = 0x812f;
  }
  if (mapU == aiTextureMapMode_Mirror) {
    uVar2 = 0x8370;
  }
  *(undefined4 *)
   (*(long *)(*(long *)(pTVar1->sampler).vector + (ulong)*(uint *)((long)&pTVar1->sampler + 8) * 8)
   + 0x50) = uVar2;
  uVar2 = 0x2901;
  if (mapV == aiTextureMapMode_Clamp) {
    uVar2 = 0x812f;
  }
  if (mapV == aiTextureMapMode_Mirror) {
    uVar2 = 0x8370;
  }
  pTVar1 = (((prop->texture).vector)->
           super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>)._M_impl.
           super__Vector_impl_data._M_start[(prop->texture).index];
  *(undefined4 *)
   (*(long *)(*(long *)(pTVar1->sampler).vector + (ulong)*(uint *)((long)&pTVar1->sampler + 8) * 8)
   + 0x54) = uVar2;
  pTVar1 = (((prop->texture).vector)->
           super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>)._M_impl.
           super__Vector_impl_data._M_start[(prop->texture).index];
  *(undefined4 *)
   (*(long *)(*(long *)(pTVar1->sampler).vector + (ulong)*(uint *)((long)&pTVar1->sampler + 8) * 8)
   + 0x48) = 0x2601;
  pTVar1 = (((prop->texture).vector)->
           super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>)._M_impl.
           super__Vector_impl_data._M_start[(prop->texture).index];
  *(undefined4 *)
   (*(long *)(*(long *)(pTVar1->sampler).vector + (ulong)*(uint *)((long)&pTVar1->sampler + 8) * 8)
   + 0x4c) = 0x2601;
  std::__cxx11::string::~string((string *)&samplerId);
  return;
}

Assistant:

void glTFExporter::GetTexSampler(const aiMaterial* mat, glTF::TexProperty& prop)
{
    std::string samplerId = mAsset->FindUniqueID("", "sampler");
    prop.texture->sampler = mAsset->samplers.Create(samplerId);

    aiTextureMapMode mapU, mapV;
    aiGetMaterialInteger(mat,AI_MATKEY_MAPPINGMODE_U_DIFFUSE(0),(int*)&mapU);
    aiGetMaterialInteger(mat,AI_MATKEY_MAPPINGMODE_V_DIFFUSE(0),(int*)&mapV);

    switch (mapU) {
        case aiTextureMapMode_Wrap:
            prop.texture->sampler->wrapS = SamplerWrap_Repeat;
            break;
        case aiTextureMapMode_Clamp:
            prop.texture->sampler->wrapS = SamplerWrap_Clamp_To_Edge;
            break;
        case aiTextureMapMode_Mirror:
            prop.texture->sampler->wrapS = SamplerWrap_Mirrored_Repeat;
            break;
        case aiTextureMapMode_Decal:
        default:
            prop.texture->sampler->wrapS = SamplerWrap_Repeat;
            break;
    };

    switch (mapV) {
        case aiTextureMapMode_Wrap:
            prop.texture->sampler->wrapT = SamplerWrap_Repeat;
            break;
        case aiTextureMapMode_Clamp:
            prop.texture->sampler->wrapT = SamplerWrap_Clamp_To_Edge;
            break;
        case aiTextureMapMode_Mirror:
            prop.texture->sampler->wrapT = SamplerWrap_Mirrored_Repeat;
            break;
        case aiTextureMapMode_Decal:
        default:
            prop.texture->sampler->wrapT = SamplerWrap_Repeat;
            break;
    };

    // Hard coded Texture filtering options because I do not know where to find them in the aiMaterial.
    prop.texture->sampler->magFilter = SamplerMagFilter_Linear;
    prop.texture->sampler->minFilter = SamplerMinFilter_Linear;
}